

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6502Implementation.hpp
# Opt level: O0

void __thiscall
CPU::MOS6502::
Processor<(CPU::MOS6502::Personality)1,_Atari2600::Cartridge::Cartridge<Atari2600::Cartridge::MNetwork>,_true>
::set_ready_line(Processor<(CPU::MOS6502::Personality)1,_Atari2600::Cartridge::Cartridge<Atari2600::Cartridge::MNetwork>,_true>
                 *this,bool active)

{
  bool active_local;
  Processor<(CPU::MOS6502::Personality)1,_Atari2600::Cartridge::Cartridge<Atari2600::Cartridge::MNetwork>,_true>
  *this_local;
  
  if (active) {
    (this->super_ProcessorBase).super_ProcessorStorage.ready_line_is_enabled_ = true;
  }
  else {
    (this->super_ProcessorBase).super_ProcessorStorage.ready_line_is_enabled_ = false;
    (this->super_ProcessorBase).super_ProcessorStorage.ready_is_active_ = false;
  }
  return;
}

Assistant:

void Processor<personality, T, uses_ready_line>::set_ready_line(bool active) {
	assert(uses_ready_line);
	if(active) {
		ready_line_is_enabled_ = true;
	} else {
		ready_line_is_enabled_ = false;
		ready_is_active_ = false;
	}
}